

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall crnd::crn_unpacker::decode_alpha_selectors(crn_unpacker *this)

{
  uint8 *puVar1;
  uint uVar2;
  uint buf_size;
  uint32 uVar3;
  unsigned_short *puVar4;
  byte bVar5;
  uint local_a8;
  uint local_a4;
  uint32 j_1;
  uint32 j;
  uint32 s1;
  uint32 s0;
  uint32 i_1;
  uint32 s1_linear;
  uint32 s0_linear;
  uint32 i;
  uint8 dxt5_from_linear [64];
  undefined1 local_38 [8];
  static_huffman_data_model dm;
  crn_unpacker *this_local;
  
  puVar1 = this->m_pData;
  dm.m_pDecode_tables = (decoder_tables *)this;
  uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&this->m_pHeader->m_alpha_selectors);
  buf_size = crn_packed_uint::operator_cast_to_unsigned_int
                       ((crn_packed_uint *)&(this->m_pHeader->m_alpha_selectors).m_size);
  symbol_codec::start_decoding(&this->m_codec,puVar1 + uVar2,buf_size);
  static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)local_38);
  symbol_codec::decode_receive_static_data_model
            (&this->m_codec,(static_huffman_data_model *)local_38);
  uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&(this->m_pHeader->m_alpha_selectors).m_num);
  vector<unsigned_short>::resize(&this->m_alpha_selectors,uVar2 * 3);
  for (s1_linear = 0; s1_linear < 0x40; s1_linear = s1_linear + 1) {
    *(byte *)((long)&s0_linear + (ulong)s1_linear) =
         *(byte *)((long)&g_dxt5_from_linear + (ulong)(s1_linear & 7)) |
         *(char *)((long)&g_dxt5_from_linear + (ulong)(s1_linear >> 3)) << 3;
  }
  i_1 = 0;
  s0 = 0;
  s1 = 0;
  while( true ) {
    uVar3 = vector<unsigned_short>::size(&this->m_alpha_selectors);
    if (uVar3 <= s1) break;
    j = 0;
    j_1 = 0;
    for (local_a4 = 0; local_a4 < 0x18; local_a4 = local_a4 + 6) {
      uVar3 = symbol_codec::decode(&this->m_codec,(static_huffman_data_model *)local_38);
      bVar5 = (byte)local_a4;
      i_1 = uVar3 << (bVar5 & 0x1f) ^ i_1;
      j = (uint)*(byte *)((long)&s0_linear + (ulong)(i_1 >> (bVar5 & 0x1f) & 0x3f)) <<
          (bVar5 & 0x1f) | j;
    }
    for (local_a8 = 0; local_a8 < 0x18; local_a8 = local_a8 + 6) {
      uVar3 = symbol_codec::decode(&this->m_codec,(static_huffman_data_model *)local_38);
      bVar5 = (byte)local_a8;
      s0 = uVar3 << (bVar5 & 0x1f) ^ s0;
      j_1 = (uint)*(byte *)((long)&s0_linear + (ulong)(s0 >> (bVar5 & 0x1f) & 0x3f)) <<
            (bVar5 & 0x1f) | j_1;
    }
    puVar4 = vector<unsigned_short>::operator[](&this->m_alpha_selectors,s1);
    *puVar4 = (unsigned_short)j;
    uVar3 = s1 + 2;
    puVar4 = vector<unsigned_short>::operator[](&this->m_alpha_selectors,s1 + 1);
    *puVar4 = (ushort)(j >> 0x10) | (ushort)(j_1 << 8);
    s1 = s1 + 3;
    puVar4 = vector<unsigned_short>::operator[](&this->m_alpha_selectors,uVar3);
    *puVar4 = (unsigned_short)(j_1 >> 8);
  }
  symbol_codec::stop_decoding(&this->m_codec);
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)local_38);
  return true;
}

Assistant:

bool decode_alpha_selectors()
        {
            m_codec.start_decoding(m_pData + m_pHeader->m_alpha_selectors.m_ofs, m_pHeader->m_alpha_selectors.m_size);
            static_huffman_data_model dm;
            m_codec.decode_receive_static_data_model(dm);
            m_alpha_selectors.resize(m_pHeader->m_alpha_selectors.m_num * 3);
            uint8 dxt5_from_linear[64];
            for (uint32 i = 0; i < 64; i++)
                dxt5_from_linear[i] = g_dxt5_from_linear[i & 7] | g_dxt5_from_linear[i >> 3] << 3;
            for (uint32 s0_linear = 0, s1_linear = 0, i = 0; i < m_alpha_selectors.size();)
            {
                uint32 s0 = 0, s1 = 0;
                for (uint32 j = 0; j < 24; s0 |= dxt5_from_linear[s0_linear >> j & 0x3F] << j, j += 6)
                    s0_linear ^= m_codec.decode(dm) << j;
                for (uint32 j = 0; j < 24; s1 |= dxt5_from_linear[s1_linear >> j & 0x3F] << j, j += 6)
                    s1_linear ^= m_codec.decode(dm) << j;
                m_alpha_selectors[i++] = s0;
                m_alpha_selectors[i++] = s0 >> 16 | s1 << 8;
                m_alpha_selectors[i++] = s1 >> 8;
            }
            m_codec.stop_decoding();
            return true;
        }